

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O3

int __thiscall QDialogPrivate::close(QDialogPrivate *this,int __fd)

{
  QWidget *this_00;
  int __fd_00;
  long in_FS_OFFSET;
  undefined **local_38;
  undefined1 *puStack_30;
  long local_20;
  
  __fd_00 = (int)&local_38;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  *(int *)(*(long *)&this_00->field_0x8 + 0x2ac) = __fd;
  if (((this->super_QWidgetPrivate).data.field_0x11 & 2) == 0) {
    local_38 = (undefined **)&DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QObject::QObject((QObject *)&local_38,(QObject *)0x0);
    local_38 = &PTR_metaObject_008012a0;
    QObject::installEventFilter(&this_00->super_QObject);
    QWidgetPrivate::close(&this->super_QWidgetPrivate,__fd_00);
    QObject::~QObject((QObject *)&local_38);
  }
  else {
    QWidget::hide(this_00);
  }
  resetModalitySetByOpen(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QDialogPrivate::close(int resultCode)
{
    Q_Q(QDialog);

    q->setResult(resultCode);

    if (!data.is_closing) {
        // Until Qt 6.3 we didn't close dialogs, so they didn't receive a QCloseEvent.
        // It is likely that subclasses implement closeEvent and handle them as rejection
        // (like QMessageBox and QProgressDialog do), so eat those events.
        struct CloseEventEater : QObject
        {
            using QObject::QObject;
        protected:
            bool eventFilter(QObject *o, QEvent *e) override
            {
                if (e->type() == QEvent::Close)
                    return true;
                return QObject::eventFilter(o, e);
            }
        } closeEventEater;
        q->installEventFilter(&closeEventEater);
        QWidgetPrivate::close();
    } else {
        // If the close was initiated outside of QDialog we will end up
        // here via QDialog::closeEvent calling reject(), in which case
        // we need to hide the dialog to ensure QDialog::closeEvent does
        // not ignore the close event. FIXME: Why is QDialog doing this?
        q->hide();
    }

    resetModalitySetByOpen();
}